

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_filename.c
# Opt level: O3

void test_read_format_zip_filename_UTF8_UTF8(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  char *pcVar4;
  archive_conflict *a;
  la_int64_t lVar5;
  archive_entry *ae;
  archive_entry *local_38;
  
  pcVar4 = setlocale(6,"en_US.UTF-8");
  if (pcVar4 != (char *)0x0) {
    extract_reference_file("test_read_format_zip_filename_utf8_jp.zip");
    a = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                     ,L'ă',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ą',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
    iVar1 = archive_read_support_format_all((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ą',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
    wVar2 = archive_read_open_filename(a,"test_read_format_zip_filename_utf8_jp.zip",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ć',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",a);
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ċ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    mVar3 = archive_entry_filetype(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ċ',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
               ,L'ĕ',anon_var_dwarf_cca24,"\"\\xe8\\xa1\\xa8\\xe3\\x81\\xa0\\xe3\\x82\\x88\\x2f\"",
               pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\x01');
    lVar5 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ė',0,"0",lVar5,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ę',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ę',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ĝ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    mVar3 = archive_entry_filetype(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ĝ',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
               ,L'ĩ',anon_var_dwarf_6a90a,
               "\"\\xe8\\xa1\\xa8\\xe3\\x81\\xa0\\xe3\\x82\\x88\\x2f\" \"\\xe4\\xb8\\x80\\xe8\\xa6\\xa7\\xe8\\xa1\\xa8\\x2e\\x74\\x78\\x74\""
               ,pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\x01');
    lVar5 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ī',5,"5",lVar5,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ĭ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ĭ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'İ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    mVar3 = archive_entry_filetype(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ı',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
               ,L'Ľ',anon_var_dwarf_6a8ea,
               "\"\\xe8\\xa1\\xa8\\xe3\\x81\\xa0\\xe3\\x82\\x88\\x2f\" \"\\xe6\\xbc\\xa2\\xe5\\xad\\x97\\x2e\\x74\\x78\\x74\""
               ,pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\x01');
    lVar5 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ŀ',5,"5",lVar5,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ŀ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ł',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ņ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    iVar1 = archive_filter_code((archive *)a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ň',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",a);
    iVar1 = archive_format((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ŉ',0x50000,"ARCHIVE_FORMAT_ZIP",(long)iVar1,"archive_format(a)",a);
    iVar1 = archive_read_close((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ō',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ō',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                 ,L'þ');
  test_skipping("en_US.UTF-8 locale not available on this system.");
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_filename_UTF8_UTF8)
{
	const char *refname = "test_read_format_zip_filename_utf8_jp.zip";
	struct archive *a;
	struct archive_entry *ae;

	/*
	 * Read UTF-8 filename in en_US.UTF-8 without charset option
	 * because the file name in the sample file is UTF-8 and
	 * Bit 11 of its general purpose bit flag is set.
	 */
	if (NULL == setlocale(LC_ALL, "en_US.UTF-8")) {
		skipping("en_US.UTF-8 locale not available on this system.");
		return;
	}
	extract_reference_file(refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify directory file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
#if defined(__APPLE__)
	/* Compare NFD string. */
	assertEqualUTF8String(
	    "\xe8\xa1\xa8\xe3\x81\x9f\xe3\x82\x99\xe3\x82\x88\x2f",
	    archive_entry_pathname(ae));
#else
	/* Compare NFC string. */
	assertEqualUTF8String(
	    "\xe8\xa1\xa8\xe3\x81\xa0\xe3\x82\x88\x2f",
	    archive_entry_pathname(ae));
#endif
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
#if defined(__APPLE__)
	/* Compare NFD string. */
	assertEqualUTF8String(
	    "\xe8\xa1\xa8\xe3\x81\x9f\xe3\x82\x99\xe3\x82\x88\x2f"
	    "\xe4\xb8\x80\xe8\xa6\xa7\xe8\xa1\xa8\x2e\x74\x78\x74",
	    archive_entry_pathname(ae));
#else
	/* Compare NFC string. */
	assertEqualUTF8String(
	    "\xe8\xa1\xa8\xe3\x81\xa0\xe3\x82\x88\x2f"
	    "\xe4\xb8\x80\xe8\xa6\xa7\xe8\xa1\xa8\x2e\x74\x78\x74",
	    archive_entry_pathname(ae));
#endif
	assertEqualInt(5, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
#if defined(__APPLE__)
	/* Compare NFD string. */
	assertEqualUTF8String(
	    "\xe8\xa1\xa8\xe3\x81\x9f\xe3\x82\x99\xe3\x82\x88\x2f"
	    "\xe6\xbc\xa2\xe5\xad\x97\x2e\x74\x78\x74",
	    archive_entry_pathname(ae));
#else
	/* Compare NFC string. */
	assertEqualUTF8String(
	    "\xe8\xa1\xa8\xe3\x81\xa0\xe3\x82\x88\x2f"
	    "\xe6\xbc\xa2\xe5\xad\x97\x2e\x74\x78\x74",
	    archive_entry_pathname(ae));
#endif
	assertEqualInt(5, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);


	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_ZIP, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}